

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# peeker.hpp
# Opt level: O1

void __thiscall
boost::xpressive::detail::xpression_peeker<char>::
accept<boost::xpressive::detail::shared_matchable<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>>,mpl_::bool_<true>>
          (xpression_peeker<char> *this,
          simple_repeat_matcher<boost::xpressive::detail::shared_matchable<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_mpl_::bool_<true>_>
          *xpr)

{
  int iVar1;
  matchable_ex<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *pmVar2;
  hash_peek_bitset<char> *phVar3;
  
  if (xpr->width_ == 1) {
    iVar1 = this->leading_simple_repeat_;
    this->leading_simple_repeat_ = iVar1 + 1;
    xpr->leading_ = -1 < iVar1;
  }
  if (xpr->min_ != 0) {
    pmVar2 = (xpr->xpr_).xpr_.px;
    (*(pmVar2->
      super_matchable<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      )._vptr_matchable[4])(pmVar2,this);
    return;
  }
  phVar3 = this->bset_;
  phVar3->icase_ = false;
  *(undefined4 *)(phVar3->bset_).super__Base_bitset<4UL>._M_w = 0xffffffff;
  *(undefined4 *)((long)(phVar3->bset_).super__Base_bitset<4UL>._M_w + 4) = 0xffffffff;
  *(undefined4 *)((phVar3->bset_).super__Base_bitset<4UL>._M_w + 1) = 0xffffffff;
  *(undefined4 *)((long)(phVar3->bset_).super__Base_bitset<4UL>._M_w + 0xc) = 0xffffffff;
  *(undefined4 *)((phVar3->bset_).super__Base_bitset<4UL>._M_w + 2) = 0xffffffff;
  *(undefined4 *)((long)(phVar3->bset_).super__Base_bitset<4UL>._M_w + 0x14) = 0xffffffff;
  *(undefined4 *)((phVar3->bset_).super__Base_bitset<4UL>._M_w + 3) = 0xffffffff;
  *(undefined4 *)((long)(phVar3->bset_).super__Base_bitset<4UL>._M_w + 0x1c) = 0xffffffff;
  return;
}

Assistant:

mpl::false_ accept(simple_repeat_matcher<Xpr, Greedy> const &xpr)
    {
        if(Greedy() && 1U == xpr.width_)
        {
            ++this->leading_simple_repeat_;
            xpr.leading_ = this->leading_simple_repeat();
        }
        0 != xpr.min_ ? xpr.xpr_.peek(*this) : this->fail(); // could be a union of xpr and next
        return mpl::false_();
    }